

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MFIter.cpp
# Opt level: O3

Box * __thiscall amrex::MFIter::growntilebox(Box *__return_storage_ptr__,MFIter *this,IntVect *ng)

{
  int iVar1;
  int d;
  long lVar2;
  Box local_34;
  
  tilebox(__return_storage_ptr__,this);
  BATransformer::operator()
            (&local_34,&(this->fabArray->boxarray).m_bat,
             (Box *)((long)(this->index_map->super_vector<int,_std::allocator<int>_>).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[this->currentIndex] * 0x1c +
                    *(long *)&(((this->fabArray->boxarray).m_ref.
                                super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                              ->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                              super__Vector_impl_data));
  lVar2 = 0;
  do {
    iVar1 = (__return_storage_ptr__->smallend).vect[lVar2];
    if (iVar1 == local_34.smallend.vect[lVar2]) {
      (__return_storage_ptr__->smallend).vect[lVar2] = iVar1 - ng->vect[lVar2];
    }
    iVar1 = (__return_storage_ptr__->bigend).vect[lVar2];
    if (iVar1 == local_34.bigend.vect[lVar2]) {
      (__return_storage_ptr__->bigend).vect[lVar2] = iVar1 + ng->vect[lVar2];
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  return __return_storage_ptr__;
}

Assistant:

Box
MFIter::growntilebox (const IntVect& ng) const noexcept
{
    Box bx = tilebox();
    const Box& vbx = validbox();
    for (int d=0; d<AMREX_SPACEDIM; ++d) {
        if (bx.smallEnd(d) == vbx.smallEnd(d)) {
            bx.growLo(d, ng[d]);
        }
        if (bx.bigEnd(d) == vbx.bigEnd(d)) {
            bx.growHi(d, ng[d]);
        }
    }
    return bx;
}